

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnReturnCallIndirectExpr
          (BinaryReaderIR *this,Index sig_index,Index table_index)

{
  Module *this_00;
  Index IVar1;
  Result RVar2;
  pointer pRVar3;
  FuncType *pFVar4;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_170;
  Location local_168;
  Var local_148;
  FuncType *local_100;
  FuncType *type;
  Var local_d8;
  Location local_90;
  Var local_70;
  unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  local_28;
  __single_object expr;
  Index table_index_local;
  Index sig_index_local;
  BinaryReaderIR *this_local;
  
  if (this->current_func_ != (Func *)0x0) {
    (this->current_func_->features_used).tailcall = true;
  }
  expr._M_t.
  super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl._0_4_ = table_index;
  expr._M_t.
  super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl._4_4_ = sig_index;
  std::make_unique<wabt::ReturnCallIndirectExpr>();
  pRVar3 = std::
           unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
           ::operator->(&local_28);
  IVar1 = expr._M_t.
          super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
          .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl._4_4_;
  GetLocation(&local_90,this);
  Var::Var(&local_70,IVar1,&local_90);
  SetFuncDeclaration(this,&pRVar3->decl,&local_70);
  Var::~Var(&local_70);
  IVar1 = (Index)expr._M_t.
                 super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                 .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl;
  GetLocation((Location *)&type,this);
  Var::Var(&local_d8,IVar1,(Location *)&type);
  pRVar3 = std::
           unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
           ::operator->(&local_28);
  Var::operator=(&pRVar3->table,&local_d8);
  Var::~Var(&local_d8);
  IVar1 = expr._M_t.
          super___uniq_ptr_impl<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::ReturnCallIndirectExpr_*,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
          .super__Head_base<0UL,_wabt::ReturnCallIndirectExpr_*,_false>._M_head_impl._4_4_;
  this_00 = this->module_;
  GetLocation(&local_168,this);
  Var::Var(&local_148,IVar1,&local_168);
  pFVar4 = Module::GetFuncType(this_00,&local_148);
  Var::~Var(&local_148);
  if (pFVar4 != (FuncType *)0x0) {
    (pFVar4->features_used).tailcall = true;
  }
  local_100 = pFVar4;
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ReturnCallIndirectExpr,std::default_delete<wabt::ReturnCallIndirectExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_170,&local_28);
  RVar2 = AppendExpr(this,&local_170);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_170);
  std::unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  ::~unique_ptr(&local_28);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnReturnCallIndirectExpr(Index sig_index,
                                                Index table_index) {
  if (current_func_) {
    // syntactically, a return_call_indirect expr can occur in an init
    // expression (outside a function)
    current_func_->features_used.tailcall = true;
  }
  auto expr = std::make_unique<ReturnCallIndirectExpr>();
  SetFuncDeclaration(&expr->decl, Var(sig_index, GetLocation()));
  expr->table = Var(table_index, GetLocation());
  FuncType* type = module_->GetFuncType(Var(sig_index, GetLocation()));
  if (type) {
    type->features_used.tailcall = true;
  }
  return AppendExpr(std::move(expr));
}